

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::v9::detail::format_dragon
               (basic_fp<unsigned___int128> value,uint flags,int num_digits,buffer<char> *buf,
               int *exp10)

{
  char *pcVar1;
  undefined1 n [16];
  undefined1 n_00 [16];
  undefined1 value_00 [16];
  bigint *this;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int i;
  long lVar6;
  undefined1 auStack_338 [12];
  int num_digits_local;
  buffer<char> *local_328;
  bigint *local_320;
  int *local_318;
  char digit;
  int local_30c;
  ulong local_308;
  bigint *local_300;
  char *local_2f8;
  bigint numerator;
  bigint denominator;
  bigint lower;
  bigint upper_store;
  
  numerator.bigits_.super_buffer<unsigned_int>.size_ = 0;
  numerator.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001cb2b0;
  numerator.bigits_.super_buffer<unsigned_int>.ptr_ = numerator.bigits_.store_;
  numerator.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  numerator.exp_ = 0;
  denominator.bigits_.super_buffer<unsigned_int>.size_ = 0;
  denominator.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001cb2b0;
  denominator.bigits_.super_buffer<unsigned_int>.ptr_ = denominator.bigits_.store_;
  denominator.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  denominator.exp_ = 0;
  local_300 = &lower;
  lower.bigits_.super_buffer<unsigned_int>.size_ = 0;
  lower.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001cb2b0;
  lower.bigits_.super_buffer<unsigned_int>.ptr_ = lower.bigits_.store_;
  lower.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  lower.exp_ = 0;
  local_320 = &upper_store;
  upper_store.bigits_.super_buffer<unsigned_int>.size_ = 0;
  upper_store.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001cb2b0;
  upper_store.bigits_.super_buffer<unsigned_int>.ptr_ = upper_store.bigits_.store_;
  upper_store.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  upper_store.exp_ = 0;
  iVar5 = (flags & 1) + 1;
  num_digits_local = num_digits;
  local_328 = buf;
  local_318 = exp10;
  if (value.e < 0) {
    if (*exp10 < 0) {
      bigint::assign_pow10(&numerator,-*exp10);
      bigint::assign(&lower,&numerator);
      if ((flags & 1) == 0) {
        local_320 = (bigint *)0x0;
      }
      else {
        local_320 = &upper_store;
        bigint::assign(local_320,&numerator);
        bigint::operator<<=(&upper_store,1);
      }
      value_00._12_4_ = num_digits_local;
      value_00._0_12_ = auStack_338;
      bigint::multiply<unsigned___int128,_0>(&numerator,(unsigned___int128)value_00);
      bigint::operator<<=(&numerator,iVar5);
      bigint::assign<unsigned_long,_0>(&denominator,1);
      bigint::operator<<=(&denominator,iVar5 - value.e);
    }
    else {
      n_00._12_4_ = num_digits;
      n_00._0_12_ = auStack_338;
      bigint::assign<unsigned___int128,_0>(&numerator,(unsigned___int128)n_00);
      bigint::operator<<=(&numerator,iVar5);
      bigint::assign_pow10(&denominator,*local_318);
      bigint::operator<<=(&denominator,iVar5 - value.e);
      bigint::assign<unsigned_long,_0>(&lower,1);
      if ((flags & 1) == 0) {
        local_320 = (bigint *)0x0;
      }
      else {
        bigint::assign<unsigned_long,_0>(&upper_store,2);
      }
    }
  }
  else {
    n._12_4_ = num_digits;
    n._0_12_ = auStack_338;
    bigint::assign<unsigned___int128,_0>(&numerator,(unsigned___int128)n);
    bigint::operator<<=(&numerator,iVar5 + value.e);
    bigint::assign<unsigned_long,_0>(&lower,1);
    bigint::operator<<=(&lower,value.e);
    if ((flags & 1) == 0) {
      local_320 = (bigint *)0x0;
    }
    else {
      local_320 = &upper_store;
      bigint::assign<unsigned_long,_0>(local_320,1);
      bigint::operator<<=(&upper_store,value.e + 1);
    }
    bigint::assign_pow10(&denominator,*local_318);
    bigint::operator<<=(&denominator,iVar5);
  }
  this = local_320;
  local_308 = (ulong)(~(uint)value.f & 1);
  if (local_320 != (bigint *)0x0) {
    local_300 = local_320;
  }
  if ((flags & 2) != 0) {
    iVar5 = add_compare(&numerator,local_300,&denominator);
    if (iVar5 + (int)local_308 == 0 || SCARRY4(iVar5,(int)local_308) != iVar5 + (int)local_308 < 0)
    {
      *local_318 = *local_318 + -1;
      bigint::multiply(&numerator,10);
      if (num_digits_local < 0) {
        bigint::multiply(&lower,10);
        if (this != (bigint *)0x0) {
          bigint::multiply(this,10);
        }
      }
    }
    if ((flags & 4) != 0) {
      adjust_precision(&num_digits_local,*local_318 + 1);
    }
  }
  if (-1 < (long)num_digits_local) {
    *local_318 = (*local_318 - num_digits_local) + 1;
    if (num_digits_local == 0) {
      bigint::multiply(&denominator,10);
      iVar5 = add_compare(&numerator,&numerator,&denominator);
      digit = 0 < iVar5 | 0x30;
      buffer<char>::push_back(local_328,&digit);
    }
    else {
      buffer<char>::try_resize(local_328,(long)num_digits_local);
      for (lVar6 = 0; lVar6 < (long)num_digits_local + -1; lVar6 = lVar6 + 1) {
        iVar5 = bigint::divmod_assign(&numerator,&denominator);
        local_328->ptr_[lVar6] = (char)iVar5 + '0';
        bigint::multiply(&numerator,10);
      }
      uVar2 = bigint::divmod_assign(&numerator,&denominator);
      iVar5 = add_compare(&numerator,&numerator,&denominator);
      if ((0 < iVar5) || ((uVar2 & 1) != 0 && iVar5 == 0)) {
        if (uVar2 == 9) {
          local_328->ptr_[(long)num_digits_local + -1] = ':';
          for (uVar4 = (ulong)(uint)num_digits_local;
              (pcVar1 = local_328->ptr_, 1 < (int)uVar4 && (pcVar1[uVar4 - 1] == ':'));
              uVar4 = uVar4 - 1) {
            pcVar1[uVar4 - 1] = '0';
            local_328->ptr_[uVar4 - 2] = local_328->ptr_[uVar4 - 2] + '\x01';
          }
          if (*pcVar1 == ':') {
            *pcVar1 = '1';
            *local_318 = *local_318 + 1;
          }
          goto LAB_00125b8e;
        }
        uVar2 = uVar2 + 1;
      }
      local_328->ptr_[(long)num_digits_local + -1] = (char)uVar2 + '0';
    }
    goto LAB_00125b8e;
  }
  num_digits_local = 0;
  local_2f8 = local_328->ptr_;
  local_30c = -(int)local_308;
  while( true ) {
    uVar2 = bigint::divmod_assign(&numerator,&denominator);
    iVar5 = compare(&numerator,&lower);
    iVar3 = add_compare(&numerator,local_300,&denominator);
    lVar6 = (long)num_digits_local;
    num_digits_local = num_digits_local + 1;
    local_2f8[lVar6] = (char)uVar2 + '0';
    if ((iVar5 < (int)local_308) || (local_30c < iVar3)) break;
    bigint::multiply(&numerator,10);
    bigint::multiply(&lower,10);
    if (local_320 != (bigint *)0x0) {
      bigint::multiply(local_320,10);
    }
  }
  if (iVar5 < (int)local_308) {
    if (local_30c < iVar3) {
      iVar5 = add_compare(&numerator,&numerator,&denominator);
      if ((0 < iVar5) || ((uVar2 & 1) != 0 && iVar5 == 0)) goto LAB_00125afa;
    }
  }
  else {
LAB_00125afa:
    local_2f8[(long)num_digits_local + -1] = local_2f8[(long)num_digits_local + -1] + '\x01';
  }
  buffer<char>::try_resize(local_328,(ulong)(uint)num_digits_local);
  *local_318 = (*local_318 - num_digits_local) + 1;
LAB_00125b8e:
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::deallocate
            (&upper_store.bigits_);
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::deallocate(&lower.bigits_)
  ;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::deallocate
            (&denominator.bigits_);
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::deallocate
            (&numerator.bigits_);
  return;
}

Assistant:

FMT_CONSTEXPR20 inline void format_dragon(basic_fp<uint128_t> value,
                                          unsigned flags, int num_digits,
                                          buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  bool is_predecessor_closer = (flags & dragon::predecessor_closer) != 0;
  int shift = is_predecessor_closer ? 2 : 1;
  if (value.e >= 0) {
    numerator = value.f;
    numerator <<= value.e + shift;
    lower = 1;
    lower <<= value.e;
    if (is_predecessor_closer) {
      upper_store = 1;
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (is_predecessor_closer) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= value.f;
    numerator <<= shift;
    denominator = 1;
    denominator <<= shift - value.e;
  } else {
    numerator = value.f;
    numerator <<= shift;
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower = 1;
    if (is_predecessor_closer) {
      upper_store = 1ULL << 1;
      upper = &upper_store;
    }
  }
  int even = static_cast<int>((value.f & 1) == 0);
  if (!upper) upper = &lower;
  if ((flags & dragon::fixup) != 0) {
    if (add_compare(numerator, *upper, denominator) + even <= 0) {
      --exp10;
      numerator *= 10;
      if (num_digits < 0) {
        lower *= 10;
        if (upper != &lower) *upper *= 10;
      }
    }
    if ((flags & dragon::fixed) != 0) adjust_precision(num_digits, exp10 + 1);
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (num_digits < 0) {
    // Generate the shortest representation.
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits == 0) {
    denominator *= 10;
    auto digit = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    buf.push_back(digit);
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}